

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstructCondense.cpp
# Opt level: O1

void __thiscall
TPZDohrSubstructCondense<double>::Contribute_Kc
          (TPZDohrSubstructCondense<double> *this,TPZMatrix<double> *Kc,TPZVec<int> *coarseindex)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  long lVar6;
  
  if (0 < (this->fCoarseNodes).fNElements) {
    lVar6 = 0;
    do {
      if (0 < (this->fCoarseNodes).fNElements) {
        lVar5 = 0;
        do {
          iVar4 = (*(Kc->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x10])(Kc);
          if (((iVar4 != 0) && (coarseindex->fStore[lVar6] <= coarseindex->fStore[lVar5])) ||
             (iVar4 = (*(Kc->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x10])(Kc),
             iVar4 == 0)) {
            if (((this->fKCi).super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar6) ||
               ((this->fKCi).super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar5)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            dVar1 = (this->fKCi).fElem
                    [(this->fKCi).super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar5 + lVar6];
            uVar2 = coarseindex->fStore[lVar6];
            uVar3 = coarseindex->fStore[lVar5];
            if ((((Kc->super_TPZBaseMatrix).fRow <= (long)(int)uVar2) || ((int)(uVar3 | uVar2) < 0))
               || ((Kc->super_TPZBaseMatrix).fCol <= (long)(int)uVar3)) {
              TPZMatrix<double>::Error("TPZMatrix<TVar>::Operator()","Index out of range");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                         ,0x33d);
            }
            iVar4 = (*(Kc->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                              (Kc,(long)(int)uVar2,(long)(int)uVar3);
            *(double *)CONCAT44(extraout_var,iVar4) =
                 dVar1 + *(double *)CONCAT44(extraout_var,iVar4);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < (this->fCoarseNodes).fNElements);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->fCoarseNodes).fNElements);
  }
  return;
}

Assistant:

void TPZDohrSubstructCondense<TVar>::Contribute_Kc(TPZMatrix<TVar> &Kc, TPZVec<int> &coarseindex) {
	int i;
	int j;
	for (i=0;i<fCoarseNodes.NElements();i++) {
		for (j=0;j<fCoarseNodes.NElements();j++) {
			if ((Kc.IsSymmetric() && coarseindex[j] >= coarseindex[i]) || !Kc.IsSymmetric()) {
				Kc(coarseindex[i],coarseindex[j]) += fKCi(i,j);				
			}
		}
	}
}